

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynastyDeck.cpp
# Opt level: O1

void __thiscall
DynastyDeck::BattleConsequences(DynastyDeck *this,bool attacker,bool won,int ap,int dp)

{
  bool bVar1;
  int iVar2;
  Type TVar3;
  BlackCard *in_RAX;
  undefined3 in_register_00000011;
  list<BlackCard_*,_std::allocator<BlackCard_*>_> *this_00;
  _List_node_base *p_Var4;
  Item *pIVar5;
  Item *pIVar6;
  Item *this_01;
  BlackCard *local_38;
  
  p_Var4 = (this->dynDeck).super__List_base<BlackCard_*,_std::allocator<BlackCard_*>_>._M_impl.
           _M_node.super__List_node_base._M_next;
  this_00 = &this->dynDeck;
  local_38 = in_RAX;
  if (CONCAT31(in_register_00000011,won) == 0) {
    if (attacker) {
      for (; p_Var4 != (_List_node_base *)this_00; p_Var4 = p_Var4->_M_next) {
        bVar1 = BlackCard::isTapped((BlackCard *)p_Var4[1]._M_next);
        if (!bVar1) {
          local_38 = (BlackCard *)p_Var4[1]._M_next;
          std::__cxx11::list<BlackCard_*,_std::allocator<BlackCard_*>_>::remove
                    (this_00,(char *)&local_38);
          if (p_Var4[1]._M_next != (_List_node_base *)0x0) {
            (**(code **)((long)(p_Var4[1]._M_next)->_M_next + 0x18))();
          }
        }
      }
    }
    else {
      for (; p_Var4 != (_List_node_base *)this_00; p_Var4 = p_Var4->_M_next) {
        bVar1 = BlackCard::isTapped((BlackCard *)p_Var4[1]._M_next);
        if (bVar1) {
          local_38 = (BlackCard *)p_Var4[1]._M_next;
          std::__cxx11::list<BlackCard_*,_std::allocator<BlackCard_*>_>::remove
                    (this_00,(char *)&local_38);
          if (p_Var4[1]._M_next != (_List_node_base *)0x0) {
            (**(code **)((long)(p_Var4[1]._M_next)->_M_next + 0x18))();
          }
        }
      }
    }
  }
  else if (attacker) {
    if (p_Var4 != (_List_node_base *)this_00) {
      this_01 = (Item *)0x0;
      pIVar6 = (Item *)0x0;
      do {
        bVar1 = BlackCard::isTapped((BlackCard *)p_Var4[1]._M_next);
        if (!bVar1) {
          this_01 = (Item *)p_Var4[1]._M_next;
          iVar2 = Personality::getAttack((Personality *)this_01);
          if (iVar2 < ap - dp) {
            BlackCard::setTapped((BlackCard *)p_Var4[1]._M_next,true);
            TVar3 = Card::getType((Card *)p_Var4[1]._M_next);
            pIVar5 = (Item *)p_Var4[1]._M_next;
            if (TVar3 != PERSONALITY) {
              BlackCard::setTapped((BlackCard *)pIVar5,true);
              TVar3 = Card::getType((Card *)p_Var4[1]._M_next);
              pIVar5 = (Item *)p_Var4[1]._M_next;
              if (TVar3 != PERSONALITY) {
                iVar2 = Item::getDurability(pIVar5);
                Item::setDurability(pIVar5,iVar2 + -1);
                pIVar6 = pIVar5;
                goto LAB_00106bd0;
              }
            }
            Personality::PersonalityConsequences((Personality *)pIVar5);
            this_01 = pIVar5;
          }
          else {
            local_38 = (BlackCard *)p_Var4[1]._M_next;
            std::__cxx11::list<BlackCard_*,_std::allocator<BlackCard_*>_>::remove
                      (this_00,(char *)&local_38);
            if (p_Var4[1]._M_next != (_List_node_base *)0x0) {
              (**(code **)((long)(p_Var4[1]._M_next)->_M_next + 0x18))();
            }
          }
        }
LAB_00106bd0:
        p_Var4 = p_Var4->_M_next;
      } while (p_Var4 != (_List_node_base *)this_00);
      goto LAB_00106d2c;
    }
  }
  else if (p_Var4 != (_List_node_base *)this_00) {
    this_01 = (Item *)0x0;
    pIVar6 = (Item *)0x0;
    do {
      bVar1 = BlackCard::isTapped((BlackCard *)p_Var4[1]._M_next);
      if (!bVar1) {
        this_01 = (Item *)p_Var4[1]._M_next;
        iVar2 = Personality::getAttack((Personality *)this_01);
        if (iVar2 < ap - dp) {
          BlackCard::setTapped((BlackCard *)p_Var4[1]._M_next,true);
          TVar3 = Card::getType((Card *)p_Var4[1]._M_next);
          pIVar5 = (Item *)p_Var4[1]._M_next;
          if (TVar3 == PERSONALITY) {
            Personality::PersonalityConsequences((Personality *)pIVar5);
            this_01 = pIVar5;
          }
          else {
            iVar2 = Item::getDurability(pIVar5);
            Item::setDurability(pIVar5,iVar2 + -1);
            pIVar6 = pIVar5;
          }
        }
        else {
          local_38 = (BlackCard *)p_Var4[1]._M_next;
          std::__cxx11::list<BlackCard_*,_std::allocator<BlackCard_*>_>::remove
                    (this_00,(char *)&local_38);
          if (p_Var4[1]._M_next != (_List_node_base *)0x0) {
            (**(code **)((long)(p_Var4[1]._M_next)->_M_next + 0x18))();
          }
        }
      }
      p_Var4 = p_Var4->_M_next;
    } while (p_Var4 != (_List_node_base *)this_00);
    goto LAB_00106d2c;
  }
  pIVar6 = (Item *)0x0;
  this_01 = (Item *)0x0;
LAB_00106d2c:
  if (this_01 != (Item *)0x0) {
    (*(this_01->super_GreenCard).super_Card._vptr_Card[3])(this_01);
  }
  if (pIVar6 != (Item *)0x0) {
    (*(pIVar6->super_GreenCard).super_Card._vptr_Card[3])(pIVar6);
  }
  return;
}

Assistant:

void DynastyDeck::BattleConsequences(bool attacker, bool won, int ap, int dp)                 //changes armies of player according to battle state
{
    list <BlackCard*>::iterator it;
    Personality* pers = nullptr;
    Item* item = nullptr;

    if (won)
    {
        if (attacker)
        {
            for (it=dynDeck.begin(); it!=dynDeck.end(); it++)
            {
                if ((*it)->isTapped())
                    continue;

                pers = reinterpret_cast<Personality*>(*it);
                if (pers->getAttack() >= ap - dp)
                {
                    popCard(*it);
                    delete *it;
                }
                else
                {
                    (*it)->setTapped(true);

                    if ((*it)->getType() == Card::PERSONALITY)
                    {
                        pers = reinterpret_cast<Personality*>(*it);
                        pers->PersonalityConsequences();
                    }
                    else
                    {
                        (*it)->setTapped(true);

                        if ((*it)->getType() == Card::PERSONALITY)
                        {
                            pers = reinterpret_cast<Personality*>(*it);
                            pers->PersonalityConsequences();
                        }
                        else
                        {
                            item = reinterpret_cast<Item*>(*it);
                            item->setDurability(item->getDurability() - 1);
                        }
                    }
                }
            }
        }
        else
        {
            for (it=dynDeck.begin(); it!=dynDeck.end(); it++)
            {
                if ((*it)->isTapped())
                    continue;

                pers = reinterpret_cast<Personality*>(*it);
                if (pers->getAttack() >= ap - dp)
                {
                    popCard(*it);
                    delete *it;
                }
                else
                {
                    (*it)->setTapped(true);

                    if ((*it)->getType() == Card::PERSONALITY)
                    {
                        pers = reinterpret_cast<Personality*>(*it);
                        pers->PersonalityConsequences();
                    }
                    else
                    {
                        item = reinterpret_cast<Item*>(*it);
                        item->setDurability(item->getDurability() - 1);
                    }
                }
            }
        }
    }
    else
    {
        if (attacker)
        {
            for (it=dynDeck.begin(); it!=dynDeck.end(); it++)
            {
                if ((*it)->isTapped())
                    continue;

                popCard(*it);
                delete *it;
            }
        }
        else
        {
            for (it=dynDeck.begin(); it!=dynDeck.end(); it++)
            {
                if (!(*it)->isTapped())
                    continue;

                popCard(*it);
                delete *it;
            }
        }
    }
    delete pers;
    delete item;
}